

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_test.cpp
# Opt level: O0

void __thiscall
biosoup::test::BiosoupSequenceTest_ReverseAndComplement_Test::TestBody
          (BiosoupSequenceTest_ReverseAndComplement_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_2;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_1;
  Message local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar;
  string local_f8;
  allocator local_d1;
  string local_d0;
  allocator local_99;
  string local_98;
  undefined1 local_78 [8];
  Sequence s;
  BiosoupSequenceTest_ReverseAndComplement_Test *this_local;
  
  s.quality.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"Test",&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"ACGTURYKMSWBDHVN",&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_f8,"0123456789:;<=>?",
             (allocator *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  Sequence::Sequence((Sequence *)local_78,&local_98,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  Sequence::ReverseAndComplement((Sequence *)local_78);
  local_114 = 0;
  testing::internal::EqHelper::Compare<int,_unsigned_int,_nullptr>
            ((EqHelper *)local_110,"0","s.id",&local_114,(uint *)local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0xf,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  testing::internal::EqHelper::
  Compare<char[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_138,"\"NBDHVWSKMRYAACGT\"","s.data",(char (*) [17])"NBDHVWSKMRYAACGT"
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((long)&s.name.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0x10,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_140);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  testing::internal::EqHelper::
  Compare<char[17],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_158,"\"?>=<;:9876543210\"","s.quality",
             (char (*) [17])"?>=<;:9876543210",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&s.data.field_2 + 8));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/rvaser[P]biosoup/test/sequence_test.cpp"
               ,0x11,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  Sequence::~Sequence((Sequence *)local_78);
  return;
}

Assistant:

TEST(BiosoupSequenceTest, ReverseAndComplement) {
  Sequence s{"Test", "ACGTURYKMSWBDHVN", "0123456789:;<=>?"};
  s.ReverseAndComplement();
  EXPECT_EQ(0, s.id);
  EXPECT_EQ("NBDHVWSKMRYAACGT", s.data);
  EXPECT_EQ("?>=<;:9876543210", s.quality);
}